

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void UpdateLockDefnsList(SstStream Stream,WS_ReaderInfo CP_WSR_Stream,long EffectiveTimestep)

{
  int iVar1;
  _ReleaseRec *p_Var2;
  
  if ((Stream->WriterDefinitionsLocked != 0) && (CP_WSR_Stream->LocalReaderDefinitionsLocked != 0))
  {
    p_Var2 = (_ReleaseRec *)
             realloc(Stream->LockDefnsList,(long)Stream->LockDefnsCount * 0x10 + 0x10);
    Stream->LockDefnsList = p_Var2;
    iVar1 = Stream->LockDefnsCount;
    p_Var2[iVar1].Timestep = EffectiveTimestep;
    p_Var2[iVar1].Reader = CP_WSR_Stream;
    Stream->LockDefnsCount = iVar1 + 1;
  }
  return;
}

Assistant:

static void UpdateLockDefnsList(SstStream Stream, WS_ReaderInfo CP_WSR_Stream,
                                long EffectiveTimestep)
{
    if (Stream->WriterDefinitionsLocked && CP_WSR_Stream->LocalReaderDefinitionsLocked)
    {
        Stream->LockDefnsList = realloc(Stream->LockDefnsList, sizeof(Stream->LockDefnsList[0]) *
                                                                   (Stream->LockDefnsCount + 1));
        Stream->LockDefnsList[Stream->LockDefnsCount].Timestep = EffectiveTimestep;
        // this only happens on rank 0, so CP_WSR_Stream is our global reader
        // stream identifier
        Stream->LockDefnsList[Stream->LockDefnsCount].Reader = CP_WSR_Stream;
        Stream->LockDefnsCount++;
    }
}